

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

int new_value(json_state *state,json_value **top,json_value **root,json_value **alloc,json_type type
             )

{
  json_type jVar1;
  json_value *pjVar2;
  int iVar3;
  char *pcVar4;
  _json_value *p_Var5;
  int values_size;
  json_value *value;
  json_type type_local;
  json_value **alloc_local;
  json_value **root_local;
  json_value **top_local;
  json_state *state_local;
  
  if (state->first_pass == 0) {
    pjVar2 = *alloc;
    *top = pjVar2;
    *alloc = (json_value *)(*alloc)->_reserved;
    if (*root == (json_value *)0x0) {
      *root = pjVar2;
    }
    jVar1 = pjVar2->type;
    if (jVar1 == json_object) {
      if ((pjVar2->u).boolean != 0) {
        iVar3 = (pjVar2->u).boolean * 0x18;
        pcVar4 = (char *)json_alloc(state,(unsigned_long)((pjVar2->u).string.ptr + iVar3),0);
        (pjVar2->u).string.ptr = pcVar4;
        if (pcVar4 == (char *)0x0) {
          return 0;
        }
        (pjVar2->_reserved).next_alloc = (_json_value *)((pjVar2->u).string.ptr + iVar3);
        (pjVar2->u).boolean = 0;
      }
    }
    else if (jVar1 == json_array) {
      if ((pjVar2->u).boolean != 0) {
        pcVar4 = (char *)json_alloc(state,(ulong)(pjVar2->u).string.length << 3,0);
        (pjVar2->u).string.ptr = pcVar4;
        if (pcVar4 == (char *)0x0) {
          return 0;
        }
        (pjVar2->u).boolean = 0;
      }
    }
    else if (jVar1 == json_string) {
      pcVar4 = (char *)json_alloc(state,(ulong)((pjVar2->u).boolean + 1),0);
      (pjVar2->u).string.ptr = pcVar4;
      if (pcVar4 == (char *)0x0) {
        return 0;
      }
      (pjVar2->u).boolean = 0;
    }
    state_local._4_4_ = 1;
  }
  else {
    p_Var5 = (_json_value *)json_alloc(state,(state->settings).value_extra + 0x28,1);
    if (p_Var5 == (_json_value *)0x0) {
      state_local._4_4_ = 0;
    }
    else {
      if (*root == (json_value *)0x0) {
        *root = p_Var5;
      }
      p_Var5->type = type;
      p_Var5->parent = *top;
      if (*alloc != (json_value *)0x0) {
        ((*alloc)->_reserved).next_alloc = p_Var5;
      }
      *top = p_Var5;
      *alloc = p_Var5;
      state_local._4_4_ = 1;
    }
  }
  return state_local._4_4_;
}

Assistant:

static int new_value (json_state * state,
                      json_value ** top, json_value ** root, json_value ** alloc,
                      json_type type)
{
   json_value * value;
   int values_size;

   if (!state->first_pass)
   {
      value = *top = *alloc;
      *alloc = (*alloc)->_reserved.next_alloc;

      if (!*root)
         *root = value;

      switch (value->type)
      {
         case json_array:

            if (value->u.array.length == 0)
               break;

            if (! (value->u.array.values = (json_value **) json_alloc
               (state, value->u.array.length * sizeof (json_value *), 0)) )
            {
               return 0;
            }

            value->u.array.length = 0;
            break;

         case json_object:

            if (value->u.object.length == 0)
               break;

            values_size = sizeof (*value->u.object.values) * value->u.object.length;

            if (! (value->u.object.values = (json_object_entry *) json_alloc
                  (state, values_size + ((unsigned long) value->u.object.values), 0)) )
            {
               return 0;
            }

            value->_reserved.object_mem = (*(char **) &value->u.object.values) + values_size;

            value->u.object.length = 0;
            break;

         case json_string:

            if (! (value->u.string.ptr = (json_char *) json_alloc
               (state, (value->u.string.length + 1) * sizeof (json_char), 0)) )
            {
               return 0;
            }

            value->u.string.length = 0;
            break;

         default:
            break;
      };

      return 1;
   }

   if (! (value = (json_value *) json_alloc
         (state, sizeof (json_value) + state->settings.value_extra, 1)))
   {
      return 0;
   }

   if (!*root)
      *root = value;

   value->type = type;
   value->parent = *top;

   #ifdef JSON_TRACK_SOURCE
      value->line = state->cur_line;
      value->col = state->cur_col;
   #endif

   if (*alloc)
      (*alloc)->_reserved.next_alloc = value;

   *alloc = *top = value;

   return 1;
}